

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfKeyValue.c
# Opt level: O2

char * sbfKeyValue_first(sbfKeyValue table,void **cookie)

{
  sbfKeyValueItemImpl *psVar1;
  sbfKeyValueItemImpl *psVar2;
  
  psVar1 = (sbfKeyValueItemImpl *)0x0;
  do {
    psVar2 = psVar1;
    psVar1 = (table->mTree).rbh_root;
    table = (sbfKeyValue)&psVar1->mTreeEntry;
  } while (psVar1 != (sbfKeyValueItemImpl *)0x0);
  if (psVar2 != (sbfKeyValueItemImpl *)0x0) {
    *cookie = psVar2;
    return psVar2->mKey;
  }
  return (char *)0x0;
}

Assistant:

const char*
sbfKeyValue_first (sbfKeyValue table, void** cookie)
{
    sbfKeyValueItem item;

    item = RB_MIN (sbfKeyValueItemTreeImpl, &table->mTree);
    if (item == NULL)
        return NULL;

    *cookie = item;
    return item->mKey;
}